

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::QTextEdit(QTextEdit *this,QTextEditPrivate *dd,QWidget *parent)

{
  QTextEditPrivate *this_00;
  QAbstractScrollAreaPrivate *in_RDX;
  QAbstractScrollArea *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  QWidget *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::QAbstractScrollArea(in_RSI,in_RDX,in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_metaObject_00d1dad8;
  in_RDI[2] = &PTR__QTextEdit_00d1dcd8;
  this_00 = d_func((QTextEdit *)0x6d11a1);
  QString::QString((QString *)0x6d11bf);
  QTextEditPrivate::init(this_00,local_20);
  QString::~QString((QString *)0x6d11d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextEdit::QTextEdit(QTextEditPrivate &dd, QWidget *parent)
    : QAbstractScrollArea(dd, parent)
{
    Q_D(QTextEdit);
    d->init();
}